

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::GetObjectLibrariesCMP0026
          (cmTarget *this,vector<cmTarget_*,_std::allocator<cmTarget_*>_> *objlibs)

{
  char cVar1;
  cmTargetInternals *pcVar2;
  cmCompiledGeneratorExpression *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  iterator __position;
  int iVar6;
  size_type sVar7;
  _Alloc_hider _Var8;
  pointer pbVar9;
  string entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmTarget *objLib;
  string objLibName;
  string local_d0;
  cmTarget *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<cmTarget*,std::allocator<cmTarget*>> *local_88;
  pointer local_80;
  cmTarget *local_78;
  string local_70;
  size_type *local_50 [2];
  size_type local_40 [2];
  
  pcVar2 = (this->Internal).Pointer;
  local_80 = (pcVar2->SourceEntries).
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_80 !=
      (pcVar2->SourceEntries).
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b0 = this;
    local_88 = (vector<cmTarget*,std::allocator<cmTarget*>> *)objlibs;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = ((*local_80)->ge).x_;
      pcVar4 = (pcVar3->Input)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar4,pcVar4 + (pcVar3->Input)._M_string_length);
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&local_d0,&local_a8,false);
      for (pbVar9 = local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 != local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        pcVar4 = (pbVar9->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar4,pcVar4 + pbVar9->_M_string_length);
        _Var8._M_p = (pointer)local_50[0];
        iVar6 = strncmp((char *)local_50[0],"$<TARGET_OBJECTS:",0x11);
        if (iVar6 == 0) {
          cVar1 = (pbVar9->_M_dataplus)._M_p[pbVar9->_M_string_length - 1];
          if ((size_type *)_Var8._M_p != local_40) {
            operator_delete(_Var8._M_p,local_40[0] + 1);
          }
          if (cVar1 == '>') {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)pbVar9);
            sVar7 = cmGeneratorExpression::Find(&local_70);
            if ((sVar7 == 0xffffffffffffffff) &&
               (local_78 = cmMakefile::FindTargetToUse(local_b0->Makefile,&local_70,false),
               local_78 != (cmTarget *)0x0)) {
              __position._M_current = *(cmTarget ***)(local_88 + 8);
              if (__position._M_current == *(cmTarget ***)(local_88 + 0x10)) {
                std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                          (local_88,__position,&local_78);
              }
              else {
                *__position._M_current = local_78;
                *(long *)(local_88 + 8) = *(long *)(local_88 + 8) + 8;
              }
            }
            _Var8._M_p = local_70._M_dataplus._M_p;
            uVar5 = local_70.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00317a67;
          }
        }
        else {
          uVar5 = local_40[0];
          if ((size_type *)_Var8._M_p != local_40) {
LAB_00317a67:
            operator_delete(_Var8._M_p,uVar5 + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_80 = local_80 + 1;
    } while (local_80 !=
             (((local_b0->Internal).Pointer)->SourceEntries).
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void
cmTarget::GetObjectLibrariesCMP0026(std::vector<cmTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  typedef cmTargetInternals::TargetPropertyEntry
                              TargetPropertyEntry;
  for(std::vector<TargetPropertyEntry*>::const_iterator
        i = this->Internal->SourceEntries.begin();
      i != this->Internal->SourceEntries.end(); ++i)
    {
    std::string entry = (*i)->ge->GetInput();

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator
        li = files.begin(); li != files.end(); ++li)
      {
      if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>')
        {
        std::string objLibName = li->substr(17, li->size()-18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
          {
          continue;
          }
        cmTarget *objLib = this->Makefile->FindTargetToUse(objLibName);
        if(objLib)
          {
          objlibs.push_back(objLib);
          }
        }
      }
    }
}